

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgWindow.cpp
# Opt level: O0

void __thiscall
ImgWindow::translateToImguiSpace(ImgWindow *this,int inX,int inY,float *outX,float *outY)

{
  float *outY_local;
  float *outX_local;
  int inY_local;
  int inX_local;
  ImgWindow *this_local;
  
  *outX = (float)(inX - this->mLeft);
  if ((*outX <= 0.0 && *outX != 0.0) || ((float)(this->mRight - this->mLeft) < *outX)) {
    *outX = -3.4028235e+38;
    *outY = -3.4028235e+38;
  }
  else {
    *outY = (float)(this->mTop - inY);
    if ((*outY <= 0.0 && *outY != 0.0) || ((float)(this->mTop - this->mBottom) < *outY)) {
      *outX = -3.4028235e+38;
      *outY = -3.4028235e+38;
    }
  }
  return;
}

Assistant:

void
ImgWindow::translateToImguiSpace(int inX, int inY, float &outX, float &outY)
{
	outX = static_cast<float>(inX - mLeft);
	if (outX < 0.0f || outX > (float)(mRight - mLeft)) {
		outX = -FLT_MAX;
		outY = -FLT_MAX;
		return;
	}
	outY = static_cast<float>(mTop-inY);
	if (outY < 0.0f || outY > (float)(mTop - mBottom)) {
		outX = -FLT_MAX;
		outY = -FLT_MAX;
		return;
	}
}